

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_alpn_protocols(mbedtls_ssl_config *conf,char **protos)

{
  size_t sVar1;
  char **local_38;
  char **p;
  size_t tot_len;
  size_t cur_len;
  char **protos_local;
  mbedtls_ssl_config *conf_local;
  
  p = (char **)0x0;
  local_38 = protos;
  while( true ) {
    if (*local_38 == (char *)0x0) {
      conf->alpn_list = protos;
      return 0;
    }
    sVar1 = strlen(*local_38);
    p = (char **)(sVar1 + (long)p);
    if (((sVar1 == 0) || (0xff < sVar1)) || ((char **)0xffff < p)) break;
    local_38 = local_38 + 1;
  }
  return -0x7100;
}

Assistant:

int mbedtls_ssl_conf_alpn_protocols( mbedtls_ssl_config *conf, const char **protos )
{
    size_t cur_len, tot_len;
    const char **p;

    /*
     * RFC 7301 3.1: "Empty strings MUST NOT be included and byte strings
     * MUST NOT be truncated."
     * We check lengths now rather than later.
     */
    tot_len = 0;
    for( p = protos; *p != NULL; p++ )
    {
        cur_len = strlen( *p );
        tot_len += cur_len;

        if( cur_len == 0 || cur_len > 255 || tot_len > 65535 )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    conf->alpn_list = protos;

    return( 0 );
}